

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> * __thiscall
cnn::Tensor::operator*(Tensor *this)

{
  uint uVar1;
  Stride<0,_0> *this_00;
  ulong cols;
  Dim *in_RSI;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_RDI;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *dataPtr;
  
  dataPtr = in_RDI;
  uVar1 = Dim::batch_elems(in_RSI);
  if (uVar1 != 1) {
    __assert_fail("d.batch_elems() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                  ,0x28,"Eigen::Map<Eigen::MatrixXf> cnn::Tensor::operator*()");
  }
  uVar1 = Dim::ndims(in_RSI);
  if (uVar1 < 3) {
    uVar1 = Dim::rows(in_RSI);
    this_00 = (Stride<0,_0> *)(ulong)uVar1;
    uVar1 = Dim::cols(in_RSI);
    cols = (ulong)uVar1;
    Eigen::Stride<0,_0>::Stride(this_00);
    Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
              ((Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)in_RSI,
               (PointerArgType)dataPtr,(Index)in_RDI,cols,this_00);
    return dataPtr;
  }
  __assert_fail("d.ndims() < 3",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                ,0x29,"Eigen::Map<Eigen::MatrixXf> cnn::Tensor::operator*()");
}

Assistant:

Eigen::Map<Eigen::MatrixXf> operator*() {
    assert(d.batch_elems() == 1);
    assert(d.ndims() < 3);
    return Eigen::Map<Eigen::MatrixXf>(v, d.rows(), d.cols());
  }